

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereSplit(WhereClause *pWC,Expr *pExpr,u8 op)

{
  Expr *pEVar1;
  Expr *pE2;
  u8 op_local;
  Expr *pExpr_local;
  WhereClause *pWC_local;
  
  pEVar1 = sqlite3ExprSkipCollate(pExpr);
  pWC->op = op;
  if (pEVar1 != (Expr *)0x0) {
    if (pEVar1->op == op) {
      sqlite3WhereSplit(pWC,pEVar1->pLeft,op);
      sqlite3WhereSplit(pWC,pEVar1->pRight,op);
    }
    else {
      whereClauseInsert(pWC,pExpr,0);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereSplit(WhereClause *pWC, Expr *pExpr, u8 op){
  Expr *pE2 = sqlite3ExprSkipCollate(pExpr);
  pWC->op = op;
  if( pE2==0 ) return;
  if( pE2->op!=op ){
    whereClauseInsert(pWC, pExpr, 0);
  }else{
    sqlite3WhereSplit(pWC, pE2->pLeft, op);
    sqlite3WhereSplit(pWC, pE2->pRight, op);
  }
}